

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int inflight_settings_new
              (nghttp2_inflight_settings **settings_ptr,nghttp2_settings_entry *iv,size_t niv,
              nghttp2_mem *mem)

{
  nghttp2_inflight_settings *pnVar1;
  nghttp2_settings_entry *pnVar2;
  nghttp2_mem *mem_local;
  size_t niv_local;
  nghttp2_settings_entry *iv_local;
  nghttp2_inflight_settings **settings_ptr_local;
  
  pnVar1 = (nghttp2_inflight_settings *)nghttp2_mem_malloc(mem,0x18);
  *settings_ptr = pnVar1;
  if (*settings_ptr == (nghttp2_inflight_settings *)0x0) {
    settings_ptr_local._4_4_ = -0x385;
  }
  else {
    if (niv == 0) {
      (*settings_ptr)->iv = (nghttp2_settings_entry *)0x0;
    }
    else {
      pnVar2 = nghttp2_frame_iv_copy(iv,niv,mem);
      (*settings_ptr)->iv = pnVar2;
      if ((*settings_ptr)->iv == (nghttp2_settings_entry *)0x0) {
        nghttp2_mem_free(mem,*settings_ptr);
        return -0x385;
      }
    }
    (*settings_ptr)->niv = niv;
    (*settings_ptr)->next = (nghttp2_inflight_settings *)0x0;
    settings_ptr_local._4_4_ = 0;
  }
  return settings_ptr_local._4_4_;
}

Assistant:

static int inflight_settings_new(nghttp2_inflight_settings **settings_ptr,
                                 const nghttp2_settings_entry *iv, size_t niv,
                                 nghttp2_mem *mem) {
  *settings_ptr = nghttp2_mem_malloc(mem, sizeof(nghttp2_inflight_settings));
  if (!*settings_ptr) {
    return NGHTTP2_ERR_NOMEM;
  }

  if (niv > 0) {
    (*settings_ptr)->iv = nghttp2_frame_iv_copy(iv, niv, mem);
    if (!(*settings_ptr)->iv) {
      nghttp2_mem_free(mem, *settings_ptr);
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    (*settings_ptr)->iv = NULL;
  }

  (*settings_ptr)->niv = niv;
  (*settings_ptr)->next = NULL;

  return 0;
}